

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_rect.cxx
# Opt level: O3

void __thiscall Fl_Graphics_Driver::point(Fl_Graphics_Driver *this,int x,int y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 1;
  if (1 < fl_line_width_) {
    iVar3 = fl_line_width_;
  }
  iVar2 = 0x7fff - iVar3;
  iVar3 = -iVar3;
  iVar1 = x;
  if (iVar2 < x) {
    iVar1 = iVar2;
  }
  if (x < iVar3) {
    iVar1 = iVar3;
  }
  if (y <= iVar2) {
    iVar2 = y;
  }
  if (y < iVar3) {
    iVar2 = iVar3;
  }
  XDrawPoint(fl_display,fl_window,fl_gc,iVar1,iVar2);
  return;
}

Assistant:

void Fl_Graphics_Driver::point(int x, int y) {
#if defined(USE_X11)
  XDrawPoint(fl_display, fl_window, fl_gc, clip_x(x), clip_x(y));
#elif defined(WIN32)
  SetPixel(fl_gc, x, y, fl_RGB());
#elif defined(__APPLE_QUARTZ__)
  CGContextFillRect(fl_gc, CGRectMake(x - 0.5, y - 0.5, 1, 1) );
#else
# error unsupported platform
#endif
}